

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O1

Unm_Man_t * Unm_ManAlloc(Gia_Man_t *pGia)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  Unm_Man_t *pUVar4;
  Gia_Man_t *p;
  size_t sVar5;
  char *pcVar6;
  Hash_IntMan_t *pHVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  abctime aVar10;
  uint uVar11;
  uint uVar12;
  timespec ts;
  timespec local_40;
  
  pUVar4 = (Unm_Man_t *)calloc(1,0x48);
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    aVar10 = -1;
  }
  else {
    aVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pUVar4->clkStart = aVar10;
  iVar2 = (pGia->nObjs * 3) / 2;
  pUVar4->nNewSize = iVar2;
  pUVar4->pGia = pGia;
  p = Gia_ManStart(iVar2);
  pUVar4->pNew = p;
  pcVar1 = pGia->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pName = pcVar6;
  pcVar1 = pGia->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pSpec = pcVar6;
  Gia_ManHashAlloc(p);
  Gia_ManCleanLevels(p,iVar2);
  p->nObjs = iVar2;
  Gia_ManIncrementTravId(p);
  p->nObjs = 1;
  pHVar7 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar12 = 1099;
  while( true ) {
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
    } while ((uVar11 & 1) != 0);
    if (uVar12 < 9) break;
    iVar2 = 5;
    while( true ) {
      if (uVar12 % (iVar2 - 2U) == 0) break;
      uVar3 = iVar2 * iVar2;
      iVar2 = iVar2 + 2;
      if (uVar12 < uVar3) goto LAB_00715572;
    }
  }
LAB_00715572:
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar11) {
    uVar3 = uVar12;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar3;
  piVar9 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar12;
  memset(piVar9,0,(long)(int)uVar12 << 2);
  pHVar7->vTable = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x1130;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x44c0);
  pVVar8->pArray = piVar9;
  pHVar7->vObjs = pVVar8;
  piVar9[0] = 0;
  piVar9[1] = 0;
  piVar9[2] = 0;
  piVar9[3] = 0;
  pVVar8->nSize = 4;
  pHVar7->nRefs = 1;
  pUVar4->pHash = pHVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = 10;
  piVar9[4] = 0;
  piVar9[5] = 0;
  piVar9[6] = 0;
  piVar9[7] = 0;
  piVar9[0] = 0;
  piVar9[1] = 0;
  piVar9[2] = 0;
  piVar9[3] = 0;
  piVar9[8] = 0;
  piVar9[9] = 0;
  pUVar4->vLeaves = pVVar8;
  return pUVar4;
}

Assistant:

Unm_Man_t * Unm_ManAlloc( Gia_Man_t * pGia )
{
    Unm_Man_t * p;
    p = ABC_CALLOC( Unm_Man_t, 1 );
    p->clkStart    = Abc_Clock();
    p->nNewSize    = 3 * Gia_ManObjNum(pGia) / 2;
    p->pGia        = pGia;
    p->pNew        = Gia_ManStart( p->nNewSize );
    p->pNew->pName = Abc_UtilStrsav( pGia->pName );
    p->pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashAlloc( p->pNew );
    Gia_ManCleanLevels( p->pNew, p->nNewSize );
    // allocate traversal IDs
    p->pNew->nObjs = p->nNewSize;
    Gia_ManIncrementTravId( p->pNew );
    p->pNew->nObjs = 1;
    // start hashing
    p->pHash = Hash_IntManStart( 1000 );
    // truth tables
    p->vLeaves = Vec_IntStart( 10 );
    return p;
}